

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,ReadOptions *options,BlockHandle *handle,
                  BlockContents *result)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  Status SVar4;
  char *pcVar5;
  uint32_t uVar6;
  char *pcVar7;
  leveldb *this_00;
  bool bVar8;
  Status s;
  Slice contents;
  Status local_80;
  leveldb *local_78;
  ReadOptions *local_70;
  Slice local_68;
  Slice local_58;
  char *local_48;
  ulong local_40;
  Status local_38;
  
  (result->data).data_ = "";
  (result->data).size_ = 0;
  result->cachable = false;
  result->heap_allocated = false;
  uVar3 = handle->size_;
  uVar1 = uVar3 + 5;
  local_78 = this;
  local_70 = options;
  pcVar7 = (char *)operator_new__(uVar1);
  local_48 = "";
  local_40 = 0;
  (*file->_vptr_RandomAccessFile[2])(&local_80,file,handle->offset_,uVar1,&local_48,pcVar7);
  pcVar5 = local_48;
  this_00 = local_78;
  if (local_80.state_ == (char *)0x0) {
    if (local_40 == uVar1) {
      if ((local_70->verify_checksums == true) &&
         (iVar2 = *(int *)(local_48 + uVar3 + 1), uVar6 = crc32c::Value(local_48,uVar3 + 1),
         uVar6 != ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
        operator_delete__(pcVar7);
        local_58.data_ = "block checksum mismatch";
        local_58.size_ = 0x17;
        local_68.data_ = "";
        local_68.size_ = 0;
        Status::Corruption(&local_38,&local_58,&local_68);
        SVar4.state_ = local_80.state_;
        local_80.state_ = local_38.state_;
        local_38.state_ = SVar4.state_;
        Status::~Status(&local_38);
        *(char **)this_00 = local_80.state_;
        goto LAB_001223e0;
      }
      if (pcVar5[uVar3] == '\x01') {
        operator_delete__(pcVar7);
        local_58.data_ = "corrupted compressed block contents";
        local_58.size_ = 0x23;
      }
      else {
        if (pcVar5[uVar3] == '\0') {
          bVar8 = pcVar5 == pcVar7;
          if (!bVar8) {
            operator_delete__(pcVar7);
            pcVar7 = pcVar5;
          }
          (result->data).data_ = pcVar7;
          (result->data).size_ = uVar3;
          result->heap_allocated = bVar8;
          result->cachable = bVar8;
          *(undefined8 *)this_00 = 0;
          goto LAB_001224a5;
        }
        operator_delete__(pcVar7);
        local_58.data_ = "bad block type";
        local_58.size_ = 0xe;
      }
    }
    else {
      operator_delete__(pcVar7);
      local_58.data_ = "truncated block read";
      local_58.size_ = 0x14;
    }
    local_68.size_ = 0;
    local_68.data_ = "";
    Status::Corruption((Status *)this_00,&local_58,&local_68);
  }
  else {
    operator_delete__(pcVar7);
    *(char **)local_78 = local_80.state_;
    this_00 = local_78;
LAB_001223e0:
    local_80.state_ = (char *)0x0;
  }
LAB_001224a5:
  Status::~Status(&local_80);
  return (Status)(char *)this_00;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

  switch (data[n]) {
    case kNoCompression:
      if (data != buf) {
        // File implementation gave us pointer to some other data.
        // Use it directly under the assumption that it will be live
        // while the file is open.
        delete[] buf;
        result->data = Slice(data, n);
        result->heap_allocated = false;
        result->cachable = false;  // Do not double-cache
      } else {
        result->data = Slice(buf, n);
        result->heap_allocated = true;
        result->cachable = true;
      }

      // Ok
      break;
    case kSnappyCompression: {
      size_t ulength = 0;
      if (!port::Snappy_GetUncompressedLength(data, n, &ulength)) {
        delete[] buf;
        return Status::Corruption("corrupted compressed block contents");
      }
      char* ubuf = new char[ulength];
      if (!port::Snappy_Uncompress(data, n, ubuf)) {
        delete[] buf;
        delete[] ubuf;
        return Status::Corruption("corrupted compressed block contents");
      }
      delete[] buf;
      result->data = Slice(ubuf, ulength);
      result->heap_allocated = true;
      result->cachable = true;
      break;
    }
    default:
      delete[] buf;
      return Status::Corruption("bad block type");
  }

  return Status::OK();
}